

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGatherLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_48,layer,2,2);
  __return_storage_ptr__->m_type = local_48._0_4_;
  __return_storage_ptr__->m_reason = local_48._4_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_48,layer,1,1);
    __return_storage_ptr__->m_type = local_48._0_4_;
    __return_storage_ptr__->m_reason = local_48._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGatherLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    return r;
}